

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistent_cohomology.h
# Opt level: O2

void __thiscall
Gudhi::persistent_cohomology::
Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>,_Gudhi::persistent_cohomology::Field_Zp>
::update_cohomology_groups
          (Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>,_Gudhi::persistent_cohomology::Field_Zp>
           *this,Simplex_handle sigma,int dim_sigma)

{
  _Rb_tree_header *p_Var1;
  int inv_x;
  pointer ppVar2;
  _Base_ptr p_Var3;
  __normal_iterator<std::pair<unsigned_long,_int>_*,_std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>_>
  __tmp;
  pointer ppVar4;
  int charac;
  A_ds_type a_ds;
  pair<unsigned_long,_int> local_70;
  map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
  map_a_ds;
  
  p_Var1 = &map_a_ds._M_t._M_impl.super__Rb_tree_header;
  map_a_ds._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  map_a_ds._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  map_a_ds._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  map_a_ds._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  map_a_ds._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  annotation_of_the_boundary(this,&map_a_ds,sigma,dim_sigma);
  if (map_a_ds._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    if (dim_sigma < this->dim_max_) {
      create_cocycle(this,sigma,1,(this->coeff_field_).Prime);
    }
LAB_0010692f:
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_int>,_std::_Select1st<std::pair<const_unsigned_long,_int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
    ::~_Rb_tree(&map_a_ds._M_t);
    return;
  }
  a_ds.
  super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  a_ds.
  super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  a_ds.
  super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (p_Var3 = map_a_ds._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != p_Var1; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    local_70.first = *(unsigned_long *)(p_Var3 + 1);
    local_70.second = *(int *)&p_Var3[1]._M_parent;
    std::vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>>::
    emplace_back<std::pair<unsigned_long,int>>
              ((vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>> *)
               &a_ds,&local_70);
  }
  charac = (this->coeff_field_).Prime;
  ppVar4 = a_ds.
           super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    do {
      if ((ppVar4 == a_ds.
                     super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) || (charac == 1)) {
        if ((charac != 1) && (dim_sigma < this->dim_max_)) {
          create_cocycle(this,sigma,1,charac);
        }
        std::
        _Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
        ::~_Vector_base(&a_ds.
                         super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                       );
        goto LAB_0010692f;
      }
      ppVar2 = ppVar4 + -1;
      ppVar4 = ppVar4 + -1;
      inv_x = (this->coeff_field_).inverse_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[ppVar2->second];
    } while (inv_x == 0);
    destroy_cocycle(this,sigma,&a_ds,ppVar4->first,inv_x,charac);
    charac = 1;
  } while( true );
}

Assistant:

void update_cohomology_groups(Simplex_handle sigma, int dim_sigma) {
// Compute the annotation of the boundary of sigma:
    std::map<Simplex_key, Arith_element> map_a_ds;
    annotation_of_the_boundary(map_a_ds, sigma, dim_sigma);
// Update the cohomology groups:
    if (map_a_ds.empty()) {  // sigma is a creator in all fields represented in coeff_field_
      if (dim_sigma < dim_max_) {
        create_cocycle(sigma, coeff_field_.multiplicative_identity(),
                       coeff_field_.characteristic());
      }
    } else {        // sigma is a destructor in at least a field in coeff_field_
      // Convert map_a_ds to a vector
      A_ds_type a_ds;  // admits reverse iterators
      for (auto map_a_ds_ref : map_a_ds) {
        a_ds.push_back(
            std::pair<Simplex_key, Arith_element>(map_a_ds_ref.first,
                                                  map_a_ds_ref.second));
      }

      Arith_element inv_x, charac;
      Arith_element prod = coeff_field_.characteristic();  // Product of characteristic of the fields
      for (auto a_ds_rit = a_ds.rbegin();
          (a_ds_rit != a_ds.rend())
              && (prod != coeff_field_.multiplicative_identity()); ++a_ds_rit) {
        std::tie(inv_x, charac) = coeff_field_.inverse(a_ds_rit->second, prod);

        if (inv_x != coeff_field_.additive_identity()) {
          destroy_cocycle(sigma, a_ds, a_ds_rit->first, inv_x, charac);
          prod /= charac;
        }
      }
      if (prod != coeff_field_.multiplicative_identity()
          && dim_sigma < dim_max_) {
        create_cocycle(sigma, coeff_field_.multiplicative_identity(prod), prod);
      }
    }
  }